

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

unsigned_long __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt<unsigned_long>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  unsigned_long value;
  unsigned_long local_10;
  
  SkipSpace(this);
  local_10 = 0;
  bVar1 = ReadIntWithoutSign<unsigned_long>(this,&local_10);
  if (!bVar1) {
    ReportError<>(this,(CStringRef)0x15c311);
  }
  return local_10;
}

Assistant:

Int ReadUInt() {
    SkipSpace();
    Int value = 0;
    if (!ReadIntWithoutSign(value))
      ReportError("expected unsigned integer");
    return value;
  }